

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

loc_conflict
choose_random_entrance
          (chunk_conflict *c,wchar_t ridx,loc_conflict *tgt,wchar_t bias,loc_conflict *exc,
          wchar_t nexc)

{
  _Bool _Var1;
  uint uVar2;
  wchar_t wVar3;
  uint32_t uVar4;
  int iVar5;
  undefined4 *p;
  loc_conflict lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  wchar_t j;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int local_48;
  
  if ((ridx < L'\0') || (dun->cent_n <= ridx)) {
    __assert_fail("ridx >= 0 && ridx < dun->cent_n",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                  ,0xcc,
                  "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                 );
  }
  if (0 < dun->ent_n[(uint)ridx]) {
    p = (undefined4 *)mem_alloc((ulong)(uint)dun->ent_n[(uint)ridx] * 4 + 4);
    *p = 0;
    uVar12 = 0;
    uVar13 = (ulong)(uint)nexc;
    if (nexc < L'\x01') {
      uVar13 = uVar12;
    }
    local_48 = 0;
    for (; (long)uVar12 < (long)dun->ent_n[(uint)ridx]; uVar12 = uVar12 + 1) {
      _Var1 = square_is_granite_with_flag(c,(loc_conflict)dun->ent[(uint)ridx][uVar12],L'\f');
      if (_Var1) {
        for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
          lVar6 = loc_diff((loc_conflict)dun->ent[(uint)ridx][uVar12],exc[uVar10]);
          uVar2 = lVar6.x;
          uVar7 = -uVar2;
          if (0 < (int)uVar2) {
            uVar7 = uVar2;
          }
          if (uVar7 < 2) {
            uVar8 = lVar6.y;
            uVar7 = -uVar8;
            if (0 < (int)uVar8) {
              uVar7 = uVar8;
            }
            if ((uVar7 < 2) && (((ulong)lVar6 >> 0x20 != 0 || (uVar2 != 0)))) goto LAB_00148a8b;
          }
        }
        if (tgt == (loc_conflict *)0x0) {
          iVar9 = p[uVar12] + 1;
        }
        else {
          if (bias < L'\0') {
            __assert_fail("bias >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                          ,0xf1,
                          "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                         );
          }
          wVar3 = distance((loc_conflict)dun->ent[(uint)ridx][uVar12],*tgt);
          if (wVar3 == L'\0') {
            mem_free(p);
            return (loc_conflict)dun->ent[(uint)ridx][uVar12];
          }
          iVar9 = bias - wVar3;
          if (iVar9 < 2) {
            iVar9 = 1;
          }
          iVar9 = iVar9 * iVar9 + p[uVar12];
        }
        p[uVar12 + 1] = iVar9;
        local_48 = local_48 + 1;
      }
      else {
LAB_00148a8b:
        p[uVar12 + 1] = p[uVar12];
      }
    }
    if (0 < local_48) {
      uVar4 = Rand_div(p[dun->ent_n[(uint)ridx]]);
      iVar9 = dun->ent_n[(uint)ridx];
      iVar5 = 0;
      while (iVar11 = iVar5, iVar11 != iVar9 + -1) {
        iVar5 = (iVar9 + iVar11) / 2;
        if ((int)uVar4 < (int)p[iVar5]) {
          iVar9 = iVar5;
          iVar5 = iVar11;
        }
      }
      if (((int)p[iVar11] <= (int)uVar4) && ((int)uVar4 < (int)p[iVar9])) {
        mem_free(p);
        return (loc_conflict)dun->ent[(uint)ridx][iVar11];
      }
      __assert_fail("accum[low] <= chosen && accum[high] > chosen",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                    ,0x115,
                    "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                   );
    }
    mem_free(p);
  }
  lVar6 = loc(0,0);
  return lVar6;
}

Assistant:

static struct loc choose_random_entrance(struct chunk *c, int ridx,
	const struct loc *tgt, int bias, const struct loc *exc, int nexc)
{
	assert(ridx >= 0 && ridx < dun->cent_n);
	if (dun->ent_n[ridx] > 0) {
		int nchoice = 0;
		int *accum = mem_alloc((dun->ent_n[ridx] + 1) *
			sizeof(*accum));
		int i;

		accum[0] = 0;
		for (i = 0; i < dun->ent_n[ridx]; ++i) {
			bool included = square_is_granite_with_flag(c,
				dun->ent[ridx][i], SQUARE_WALL_OUTER);

			if (included) {
				int j = 0;

				while (1) {
					struct loc diff;

					if (j >= nexc) {
						break;
					}
					diff = loc_diff(dun->ent[ridx][i],
						exc[j]);
					if (ABS(diff.x) <= 1 &&
							ABS(diff.y) <= 1 &&
							(diff.x != 0 ||
							diff.y != 0)) {
						included = false;
						break;
					}
					++j;
				}
			}
			if (included) {
				if (tgt) {
					int d, biased;

					assert(bias >= 0);
					d = distance(dun->ent[ridx][i], *tgt);
					if (d == 0) {
						/*
						 * There's an exact match.  Use
						 * it.
						 */
						mem_free(accum);
						return dun->ent[ridx][i];
					}

					biased = MAX(1, bias - d);
					/*
					 * Squaring here is just a guess without
					 * any specific reason to back it.
					 */
					accum[i + 1] = accum[i] +
						biased * biased;
				} else {
					accum[i + 1] = accum[i] + 1;
				}
				++nchoice;
			} else {
				accum[i + 1] = accum[i];
			}
		}
		if (nchoice > 0) {
			int chosen = randint0(accum[dun->ent_n[ridx]]);
			int low = 0, high = dun->ent_n[ridx];

			/* Locate the selection by binary search. */
			while (1) {
				int mid;

				if (low == high - 1) {
					assert(accum[low] <= chosen &&
						accum[high] > chosen);
					mem_free(accum);
					return dun->ent[ridx][low];
				}
				mid = (low + high) / 2;
				if (accum[mid] <= chosen) {
					low = mid;
				} else {
					high = mid;
				}
			}
		}
		mem_free(accum);
	}

	/* There's no satisfactory marked entrances. */
	return loc(0, 0);
}